

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultNamerDisposer.cpp
# Opt level: O0

void __thiscall
ApprovalTests::DefaultNamerDisposer::~DefaultNamerDisposer(DefaultNamerDisposer *this)

{
  NamerCreator *in_RDI;
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *in_stack_ffffffffffffffd8;
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *in_stack_ffffffffffffffe0;
  
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::function
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  DefaultNamerFactory::setDefaultNamer(in_RDI);
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::~function
            ((function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)0x2034a5);
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::~function
            ((function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)0x2034af);
  return;
}

Assistant:

DefaultNamerDisposer::~DefaultNamerDisposer()
    {
        DefaultNamerFactory::setDefaultNamer(previous_result);
    }